

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O0

enumeration
trial::dynamic::convert::
into<enum_class_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
          (basic_variable<std::allocator<char>_> *u)

{
  bool bVar1;
  enumeration eVar2;
  error *this;
  error_code ec;
  undefined1 auStack_20 [4];
  enumeration result;
  error_code error;
  basic_variable<std::allocator<char>_> *u_local;
  
  error._M_cat = (error_category *)u;
  std::error_code::error_code((error_code *)auStack_20);
  eVar2 = into<enum_class_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>_> *)error._M_cat,(error_code *)auStack_20)
  ;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_20);
  if (!bVar1) {
    return eVar2;
  }
  this = (error *)__cxa_allocate_exception(0x20);
  ec._0_8_ = _auStack_20 & 0xffffffff;
  ec._M_cat = (error_category *)error._0_8_;
  dynamic::error::error(this,ec);
  __cxa_throw(this,&dynamic::error::typeinfo,dynamic::error::~error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}